

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

WallTime __thiscall
miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator+
          (TimeBase<miniros::WallTime,_miniros::WallDuration> *this,WallDuration *rhs)

{
  TimeBase<miniros::WallTime,_miniros::WallDuration> TVar1;
  int64_t nsec_sum;
  int64_t sec_sum;
  uint32_t local_28;
  uint32_t uStack_24;
  long local_20;
  long local_18;
  
  local_18 = (long)(rhs->super_DurationBase<miniros::WallDuration>).sec + (ulong)this->sec;
  local_20 = (long)(rhs->super_DurationBase<miniros::WallDuration>).nsec + (ulong)this->nsec;
  miniros::normalizeSecNSecUnsigned(&local_18,&local_20);
  local_28 = (uint32_t)local_18;
  uStack_24 = (uint32_t)local_20;
  miniros::normalizeSecNSec(&local_28,&uStack_24);
  TVar1.nsec = uStack_24;
  TVar1.sec = local_28;
  return (WallTime)TVar1;
}

Assistant:

T TimeBase<T, D>::operator+(const D &rhs) const
  {
    int64_t sec_sum  = static_cast<uint64_t>(sec) + static_cast<uint64_t>(rhs.sec);
    int64_t nsec_sum = static_cast<uint64_t>(nsec) + static_cast<uint64_t>(rhs.nsec);

    // Throws an exception if we go out of 32-bit range
    normalizeSecNSecUnsigned(sec_sum, nsec_sum);

    // now, it's safe to downcast back to uint32 bits
    return T(static_cast<uint32_t>(sec_sum), static_cast<uint32_t>(nsec_sum));
  }